

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp4::groebnerRow7_0000_f
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix,int targetRow)

{
  Scalar SVar1;
  Scalar *pSVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double factor;
  Index in_stack_ffffffffffffff28;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *in_stack_ffffffffffffff30;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *this;
  
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0x958f90);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *)*pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x958fb1);
  dVar3 = (double)this / *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x958fde);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x95900c);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959030);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pSVar2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar4,auVar15,auVar26);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959086);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x9590aa);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = SVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pSVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar5,auVar16,auVar27);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959100);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959124);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = SVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *pSVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar6,auVar17,auVar28);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x95917a);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x95919e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *pSVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar7,auVar18,auVar29);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x9591f4);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959218);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar1;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *pSVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar8,auVar19,auVar30);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x95926e);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959292);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *pSVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar9,auVar20,auVar31);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x9592e8);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x95930c);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = SVar1;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pSVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar10,auVar21,auVar32);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959365);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x95938c);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *pSVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar11,auVar22,auVar33);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x9593eb);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959412);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = SVar1;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *pSVar2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar12,auVar23,auVar34);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959471);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x959498);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *pSVar2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar13,auVar24,auVar35);
  *pSVar2 = auVar4._0_8_;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x9594f7);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,in_stack_ffffffffffffff28,0x95951e);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = SVar1;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *pSVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = -dVar3;
  auVar4 = vfmadd213sd_fma(auVar14,auVar25,auVar36);
  *pSVar2 = auVar4._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::groebnerRow7_0000_f( Eigen::Matrix<double,25,37> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,25) / groebnerMatrix(7,25);
  groebnerMatrix(targetRow,25) = 0.0;
  groebnerMatrix(targetRow,26) -= factor * groebnerMatrix(7,26);
  groebnerMatrix(targetRow,27) -= factor * groebnerMatrix(7,27);
  groebnerMatrix(targetRow,28) -= factor * groebnerMatrix(7,28);
  groebnerMatrix(targetRow,29) -= factor * groebnerMatrix(7,29);
  groebnerMatrix(targetRow,30) -= factor * groebnerMatrix(7,30);
  groebnerMatrix(targetRow,31) -= factor * groebnerMatrix(7,31);
  groebnerMatrix(targetRow,32) -= factor * groebnerMatrix(7,32);
  groebnerMatrix(targetRow,33) -= factor * groebnerMatrix(7,33);
  groebnerMatrix(targetRow,34) -= factor * groebnerMatrix(7,34);
  groebnerMatrix(targetRow,35) -= factor * groebnerMatrix(7,35);
  groebnerMatrix(targetRow,36) -= factor * groebnerMatrix(7,36);
}